

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O0

int ConnectRazorAHRS(RAZORAHRS *pRazorAHRS,char *szCfgFilePath)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint8 local_938 [8];
  char calibbuf [2048];
  char *streammodebuf;
  char *outputmodebuf;
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  RAZORAHRS *pRazorAHRS_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  calibbuf._2040_8_ = anon_var_dwarf_3c97;
  memset(pRazorAHRS->szCfgFilePath,0,0x100);
  sprintf(pRazorAHRS->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar2 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar2 != 0) {
    memset(&outputmodebuf,0,0x100);
    memset(pRazorAHRS->szDevPath,0,0x100);
    sprintf(pRazorAHRS->szDevPath,"COM1");
    pRazorAHRS->BaudRate = 0xe100;
    pRazorAHRS->timeout = 2000;
    pRazorAHRS->threadperiod = 0x32;
    pRazorAHRS->bSaveRawData = 1;
    pRazorAHRS->bROSMode = 1;
    pRazorAHRS->bSendCalibration = 0;
    pRazorAHRS->accel_x_min = 0.0;
    pRazorAHRS->accel_x_max = 0.0;
    pRazorAHRS->accel_y_min = 0.0;
    pRazorAHRS->accel_y_max = 0.0;
    pRazorAHRS->accel_z_min = 0.0;
    pRazorAHRS->accel_z_max = 0.0;
    pRazorAHRS->magn_x_min = 0.0;
    pRazorAHRS->magn_x_max = 0.0;
    pRazorAHRS->magn_y_min = 0.0;
    pRazorAHRS->magn_y_max = 0.0;
    pRazorAHRS->magn_z_min = 0.0;
    pRazorAHRS->magn_z_max = 0.0;
    pRazorAHRS->calibration_magn_use_extended = 0;
    pRazorAHRS->ccx = 0.0;
    pRazorAHRS->ccy = 0.0;
    pRazorAHRS->ccz = 0.0;
    pRazorAHRS->ctxX = 0.0;
    pRazorAHRS->ctxY = 0.0;
    pRazorAHRS->ctxZ = 0.0;
    pRazorAHRS->ctyX = 0.0;
    pRazorAHRS->ctyY = 0.0;
    pRazorAHRS->ctyZ = 0.0;
    pRazorAHRS->ctzX = 0.0;
    pRazorAHRS->ctzY = 0.0;
    pRazorAHRS->ctzZ = 0.0;
    pRazorAHRS->gyro_average_offset_x = 0.0;
    pRazorAHRS->gyro_average_offset_y = 0.0;
    pRazorAHRS->gyro_average_offset_z = 0.0;
    pRazorAHRS->rollorientation = 0.0;
    pRazorAHRS->rollp1 = 0.0;
    pRazorAHRS->rollp2 = 0.0;
    pRazorAHRS->pitchorientation = 0.0;
    pRazorAHRS->pitchp1 = 0.0;
    pRazorAHRS->pitchp2 = 0.0;
    pRazorAHRS->yaworientation = 0.0;
    pRazorAHRS->yawp1 = 0.0;
    pRazorAHRS->yawp2 = 0.0;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%255s",pRazorAHRS->szDevPath);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->BaudRate);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->timeout);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->threadperiod);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->bSaveRawData);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->bROSMode);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->bSendCalibration);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_x_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_x_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_y_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_y_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_z_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->accel_z_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_x_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_x_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_y_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_y_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_z_min);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->magn_z_max);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%d",&pRazorAHRS->calibration_magn_use_extended);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ccx);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ccy);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ccz);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctxX);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctxY);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctxZ);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctyX);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctyY);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctyZ);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctzX);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctzY);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->ctzZ);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->gyro_average_offset_x);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->gyro_average_offset_y);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->gyro_average_offset_z);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->rollorientation);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->rollp1);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->rollp2);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->pitchorientation);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->pitchp1);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->pitchp2);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->yaworientation);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->yawp1);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar3 = fgets3((FILE *)line._248_8_,(char *)&outputmodebuf,0x100);
      if (pcVar3 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = __isoc99_sscanf(&outputmodebuf,"%lf",&pRazorAHRS->yawp2);
      if (iVar2 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar2 = fclose((FILE *)line._248_8_);
      if (iVar2 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pRazorAHRS->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pRazorAHRS->threadperiod = 0x32;
  }
  memset(&pRazorAHRS->LastRazorAHRSData,0,0x60);
  iVar2 = OpenRS232Port(&pRazorAHRS->RS232Port,pRazorAHRS->szDevPath);
  if (iVar2 == 0) {
    iVar2 = SetOptionsRS232Port(&pRazorAHRS->RS232Port,pRazorAHRS->BaudRate,'\0',0,'\b','\x02',
                                pRazorAHRS->timeout);
    if (iVar2 == 0) {
      if (pRazorAHRS->bSendCalibration != 0) {
        memset(local_938,0,0x800);
        if (pRazorAHRS->calibration_magn_use_extended == 0) {
          sprintf((char *)local_938,
                  "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#cgx%.4f#cgy%.4f#cgz%.4f"
                  ,pRazorAHRS->accel_x_min,pRazorAHRS->accel_x_max,pRazorAHRS->accel_y_min,
                  pRazorAHRS->accel_y_max,pRazorAHRS->accel_z_min,pRazorAHRS->accel_z_max,
                  pRazorAHRS->magn_x_min,pRazorAHRS->magn_x_max);
        }
        else {
          sprintf((char *)local_938,
                  "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#ccx%.4f#ccy%.4f#ccz%.4f#ctxX%.4f#ctxY%.4f#ctxZ%.4f#ctyX%.4f#ctyY%.4f#ctyZ%.4f#ctzX%.4f#ctzY%.4f#ctzZ%.4f#cgx%.4f#cgy%.4f#cgz%.4f"
                  ,pRazorAHRS->accel_x_min,pRazorAHRS->accel_x_max,pRazorAHRS->accel_y_min,
                  pRazorAHRS->accel_y_max,pRazorAHRS->accel_z_min,pRazorAHRS->accel_z_max,
                  pRazorAHRS->magn_x_min,pRazorAHRS->magn_x_max);
        }
        sVar4 = strlen((char *)local_938);
        iVar2 = WriteAllRS232Port(&pRazorAHRS->RS232Port,local_938,(int)sVar4);
        if (iVar2 != 0) {
          printf("Unable to connect to a RazorAHRS : Failed to send calibration data.\n");
          CloseRS232Port(&pRazorAHRS->RS232Port);
          return 1;
        }
        if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          sVar4 = strlen((char *)local_938);
          fwrite(local_938,sVar4,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
      }
      if (pRazorAHRS->bROSMode != 0) {
        sVar4 = strlen("#ox");
        iVar2 = WriteAllRS232Port(&pRazorAHRS->RS232Port,(uint8 *)"#ox",(int)sVar4);
        if (iVar2 != 0) {
          printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
          CloseRS232Port(&pRazorAHRS->RS232Port);
          return 1;
        }
        if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          sVar4 = strlen("#ox");
          fwrite("#ox",sVar4,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
        uVar1 = calibbuf._2040_8_;
        sVar4 = strlen((char *)calibbuf._2040_8_);
        iVar2 = WriteAllRS232Port(&pRazorAHRS->RS232Port,(uint8 *)uVar1,(int)sVar4);
        uVar1 = calibbuf._2040_8_;
        if (iVar2 != 0) {
          printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
          CloseRS232Port(&pRazorAHRS->RS232Port);
          return 1;
        }
        if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          sVar4 = strlen((char *)calibbuf._2040_8_);
          fwrite((void *)uVar1,sVar4,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
      }
      printf("RazorAHRS connected.\n");
      pRazorAHRS_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a RazorAHRS.\n");
      CloseRS232Port(&pRazorAHRS->RS232Port);
      pRazorAHRS_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a RazorAHRS.\n");
    pRazorAHRS_local._4_4_ = 1;
  }
  return pRazorAHRS_local._4_4_;
}

Assistant:

inline int ConnectRazorAHRS(RAZORAHRS* pRazorAHRS, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* outputmodebuf = "#ox";
	char* streammodebuf = "#o1";
	char calibbuf[2048];

	memset(pRazorAHRS->szCfgFilePath, 0, sizeof(pRazorAHRS->szCfgFilePath));
	sprintf(pRazorAHRS->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRazorAHRS->szDevPath, 0, sizeof(pRazorAHRS->szDevPath));
		sprintf(pRazorAHRS->szDevPath, "COM1");
		pRazorAHRS->BaudRate = 57600;
		pRazorAHRS->timeout = 2000;
		pRazorAHRS->threadperiod = 50;
		pRazorAHRS->bSaveRawData = 1;
		pRazorAHRS->bROSMode = 1;
		pRazorAHRS->bSendCalibration = 0;
		pRazorAHRS->accel_x_min = 0; pRazorAHRS->accel_x_max = 0;
		pRazorAHRS->accel_y_min = 0; pRazorAHRS->accel_y_max = 0;
		pRazorAHRS->accel_z_min = 0; pRazorAHRS->accel_z_max = 0;
		pRazorAHRS->magn_x_min = 0; pRazorAHRS->magn_x_max = 0;
		pRazorAHRS->magn_y_min = 0; pRazorAHRS->magn_y_max = 0;
		pRazorAHRS->magn_z_min = 0; pRazorAHRS->magn_z_max = 0;
		pRazorAHRS->calibration_magn_use_extended = 0;
		pRazorAHRS->ccx = 0; pRazorAHRS->ccy = 0; pRazorAHRS->ccz = 0;
		pRazorAHRS->ctxX = 0; pRazorAHRS->ctxY = 0; pRazorAHRS->ctxZ = 0;
		pRazorAHRS->ctyX = 0; pRazorAHRS->ctyY = 0; pRazorAHRS->ctyZ = 0;
		pRazorAHRS->ctzX = 0; pRazorAHRS->ctzY = 0; pRazorAHRS->ctzZ = 0;
		pRazorAHRS->gyro_average_offset_x = 0; pRazorAHRS->gyro_average_offset_y = 0; pRazorAHRS->gyro_average_offset_z = 0;
		pRazorAHRS->rollorientation = 0;
		pRazorAHRS->rollp1 = 0;
		pRazorAHRS->rollp2 = 0;
		pRazorAHRS->pitchorientation = 0;
		pRazorAHRS->pitchp1 = 0;
		pRazorAHRS->pitchp2 = 0;
		pRazorAHRS->yaworientation = 0;
		pRazorAHRS->yawp1 = 0;
		pRazorAHRS->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRazorAHRS->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bROSMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSendCalibration) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->calibration_magn_use_extended) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccx) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccy) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccz) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzZ) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_x) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_y) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_z) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRazorAHRS->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRazorAHRS->threadperiod = 50;
	}

	// Used to save raw data, should be handled specifically...
	//pRazorAHRS->pfSaveFile = NULL;

	memset(&pRazorAHRS->LastRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (OpenRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pRazorAHRS->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		CloseRS232Port(&pRazorAHRS->RS232Port);
		return EXIT_FAILURE;
	}

	if (pRazorAHRS->bSendCalibration)
	{
		memset(calibbuf, 0, sizeof(calibbuf));
		if (pRazorAHRS->calibration_magn_use_extended)
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#ccx%.4f#ccy%.4f#ccz%.4f"
				"#ctxX%.4f#ctxY%.4f#ctxZ%.4f"
				"#ctyX%.4f#ctyY%.4f#ctyZ%.4f"
				"#ctzX%.4f#ctzY%.4f#ctzZ%.4f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->ccx, pRazorAHRS->ccy, pRazorAHRS->ccz,
				pRazorAHRS->ctxX, pRazorAHRS->ctxY, pRazorAHRS->ctxZ,
				pRazorAHRS->ctyX, pRazorAHRS->ctyY, pRazorAHRS->ctyZ,
				pRazorAHRS->ctzX, pRazorAHRS->ctzY, pRazorAHRS->ctzZ,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		else
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)calibbuf, (int)strlen(calibbuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Failed to send calibration data.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
		{
			fwrite(calibbuf, strlen(calibbuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	if (pRazorAHRS->bROSMode)
	{
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)outputmodebuf, (int)strlen(outputmodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(outputmodebuf, strlen(outputmodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)streammodebuf, (int)strlen(streammodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(streammodebuf, strlen(streammodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	printf("RazorAHRS connected.\n");

	return EXIT_SUCCESS;
}